

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O2

void __thiscall cbtGImpactMeshShapePart::unlockChildShapes(cbtGImpactMeshShapePart *this)

{
  return;
}

Assistant:

void cbtGImpactMeshShapePart::unlockChildShapes() const
{
	// moved from .h to .cpp because of conditional compilation
#if !BT_THREADSAFE
	// called in the narrowphase -- not threadsafe!
	void* dummy = (void*)(m_box_set.getPrimitiveManager());
	TrimeshPrimitiveManager* dummymanager = static_cast<TrimeshPrimitiveManager*>(dummy);
	dummymanager->unlock();
#endif
}